

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

void __thiscall
ON_PointCloud::ON_PointCloud(ON_PointCloud *this,double *P0,int dim,bool is_rat,int count)

{
  int count_local;
  bool is_rat_local;
  int dim_local;
  double *P0_local;
  ON_PointCloud *this_local;
  
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b767a8;
  ON_3dPointArray::ON_3dPointArray(&this->m_P,count);
  ON_SimpleArray<ON_3dVector>::ON_SimpleArray(&this->m_N);
  ON_SimpleArray<ON_Color>::ON_SimpleArray(&this->m_C);
  ON_SimpleArray<double>::ON_SimpleArray(&this->m_V);
  ON_SimpleArray<bool>::ON_SimpleArray(&this->m_H);
  this->m_hidden_count = 0;
  ON_Plane::ON_Plane(&this->m_plane);
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  this->m_flags = 0;
  ON_3dPointArray::Create(&this->m_P,dim,is_rat & 1,count,dim + (is_rat & 1),P0);
  return;
}

Assistant:

ON_PointCloud::ON_PointCloud(const double* P0, int dim, bool is_rat, int count) : m_P(count)
{
  m_P.Create(dim, is_rat, count, dim + is_rat, P0);
}